

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O1

void __thiscall
EnvironmentMap::CmdTransferOwnership
          (EnvironmentMap *this,shared_ptr<myvk::CommandBuffer> *command_buffer,
          uint32_t src_queue_family,uint32_t dst_queue_family,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage)

{
  element_type *this_00;
  CommandBuffer *this_01;
  initializer_list<VkImageMemoryBarrier> __l;
  allocator_type local_119;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_118;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> local_f8;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_d8;
  VkImageMemoryBarrier local_c0;
  VkImageMemoryBarrier local_78;
  
  this_00 = (this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (element_type *)0x0) {
    this_01 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    local_f8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    myvk::ImageBase::GetMemoryBarrier
              (&local_c0,&this_00->super_ImageBase,1,0,0,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
               VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,src_queue_family,dst_queue_family);
    myvk::ImageBase::GetMemoryBarrier
              (&local_78,
               &((this->m_alias_table_image).
                 super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ImageBase,1,0,0,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
               VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,src_queue_family,dst_queue_family);
    __l._M_len = 2;
    __l._M_array = &local_c0;
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
              (&local_d8,__l,&local_119);
    myvk::CommandBuffer::CmdPipelineBarrier
              (this_01,src_stage,dst_stage,&local_f8,&local_118,&local_d8);
    if (local_d8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EnvironmentMap::CmdTransferOwnership(const std::shared_ptr<myvk::CommandBuffer> &command_buffer,
                                          uint32_t src_queue_family, uint32_t dst_queue_family,
                                          VkPipelineStageFlags src_stage, VkPipelineStageFlags dst_stage) const {
	if (Empty())
		return;
	command_buffer->CmdPipelineBarrier(
	    src_stage, dst_stage, {}, {},
	    {m_hdr_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
	                                   VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, src_queue_family, dst_queue_family),
	     m_alias_table_image->GetMemoryBarrier(
	         VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
	         VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, src_queue_family, dst_queue_family)});
}